

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNodePtr xmlAddPrevSibling(xmlNodePtr cur,xmlNodePtr elem)

{
  _xmlNode *p_Var1;
  xmlChar *pxVar2;
  xmlNodePtr pxVar3;
  
  if (cur == (xmlNodePtr)0x0) {
    pxVar3 = (xmlNodePtr)0x0;
  }
  else {
    pxVar3 = (xmlNodePtr)0x0;
    if ((elem != (xmlNodePtr)0x0) && (cur->type != XML_NAMESPACE_DECL)) {
      pxVar3 = (xmlNodePtr)0x0;
      if ((cur != elem) && (pxVar3 = (xmlNodePtr)0x0, elem->type != XML_NAMESPACE_DECL)) {
        xmlUnlinkNode(elem);
        if (elem->type == XML_ATTRIBUTE_NODE) {
          pxVar3 = xmlAddPropSibling(cur->prev,cur,elem);
          return pxVar3;
        }
        if (elem->type == XML_TEXT_NODE) {
          if (cur->type == XML_TEXT_NODE) {
            pxVar2 = xmlStrdup(elem->content);
            pxVar2 = xmlStrcat(pxVar2,cur->content);
            xmlNodeSetContent(cur,pxVar2);
            (*xmlFree)(pxVar2);
            xmlFreeNode(elem);
            return cur;
          }
          pxVar3 = cur->prev;
          if (((pxVar3 != (xmlNodePtr)0x0) && (pxVar3->type == XML_TEXT_NODE)) &&
             (cur->name == pxVar3->name)) {
            xmlNodeAddContent(pxVar3,elem->content);
            xmlFreeNode(elem);
            return cur->prev;
          }
        }
        if (elem->doc != cur->doc) {
          xmlSetTreeDoc(elem,cur->doc);
        }
        p_Var1 = cur->parent;
        elem->parent = p_Var1;
        elem->next = cur;
        elem->prev = cur->prev;
        cur->prev = elem;
        if (elem->prev != (_xmlNode *)0x0) {
          elem->prev->next = elem;
        }
        pxVar3 = elem;
        if ((p_Var1 != (_xmlNode *)0x0) && (p_Var1->children == cur)) {
          p_Var1->children = elem;
        }
      }
    }
  }
  return pxVar3;
}

Assistant:

xmlNodePtr
xmlAddPrevSibling(xmlNodePtr cur, xmlNodePtr elem) {
    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddPrevSibling : cur == NULL\n");
#endif
	return(NULL);
    }
    if ((elem == NULL) || (elem->type == XML_NAMESPACE_DECL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddPrevSibling : elem == NULL\n");
#endif
	return(NULL);
    }

    if (cur == elem) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddPrevSibling : cur == elem\n");
#endif
	return(NULL);
    }

    xmlUnlinkNode(elem);

    if (elem->type == XML_TEXT_NODE) {
	if (cur->type == XML_TEXT_NODE) {
	    xmlChar *tmp;

	    tmp = xmlStrdup(elem->content);
	    tmp = xmlStrcat(tmp, cur->content);
	    xmlNodeSetContent(cur, tmp);
	    xmlFree(tmp);
	    xmlFreeNode(elem);
	    return(cur);
	}
	if ((cur->prev != NULL) && (cur->prev->type == XML_TEXT_NODE) &&
            (cur->name == cur->prev->name)) {
	    xmlNodeAddContent(cur->prev, elem->content);
	    xmlFreeNode(elem);
	    return(cur->prev);
	}
    } else if (elem->type == XML_ATTRIBUTE_NODE) {
		return xmlAddPropSibling(cur->prev, cur, elem);
    }

    if (elem->doc != cur->doc) {
	xmlSetTreeDoc(elem, cur->doc);
    }
    elem->parent = cur->parent;
    elem->next = cur;
    elem->prev = cur->prev;
    cur->prev = elem;
    if (elem->prev != NULL)
	elem->prev->next = elem;
    if ((elem->parent != NULL) && (elem->parent->children == cur)) {
		elem->parent->children = elem;
    }
    return(elem);
}